

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O3

QString * QFSFileEngine::currentPath(QString *__return_storage_ptr__,QString *param_1)

{
  long in_FS_OFFSET;
  QFileSystemEntry local_50;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QFileSystemEngine::currentPath();
  QFileSystemEntry::filePath(__return_storage_ptr__,&local_50);
  if (&(local_50.m_nativeFilePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_50.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_50.m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_50.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_50.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_50.m_filePath.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFSFileEngine::currentPath(const QString &)
{
    return QFileSystemEngine::currentPath().filePath();
}